

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O0

int ft_lzwstate_stack_grow(FT_LzwState state)

{
  FT_Free_Func p_Var1;
  void *local_38;
  FT_Offset new_size;
  FT_Offset old_size;
  FT_Memory pFStack_20;
  FT_Error error;
  FT_Memory memory;
  FT_LzwState state_local;
  
  if (state->stack_size <= (ulong)state->stack_top) {
    pFStack_20 = state->memory;
    new_size = state->stack_size;
    local_38 = (void *)(new_size + (new_size >> 1) + 4);
    if (state->stack == state->stack_0) {
      state->stack = (FT_Byte *)0x0;
      new_size = 0;
    }
    if (((void *)0x10000 < local_38) && (local_38 = (void *)0x10000, new_size == 0x10000)) {
      return -1;
    }
    memory = (FT_Memory)state;
    p_Var1 = (FT_Free_Func)
             ft_mem_qrealloc(pFStack_20,1,new_size,(FT_Long)local_38,state->stack,
                             (FT_Error *)((long)&old_size + 4));
    memory[3].free = p_Var1;
    if (old_size._4_4_ != 0) {
      return -1;
    }
    if (new_size == 0) {
      memcpy(memory[3].free,&memory[4].alloc,0x40);
    }
    memory[4].user = local_38;
  }
  return 0;
}

Assistant:

static int
  ft_lzwstate_stack_grow( FT_LzwState  state )
  {
    if ( state->stack_top >= state->stack_size )
    {
      FT_Memory  memory = state->memory;
      FT_Error   error;
      FT_Offset  old_size = state->stack_size;
      FT_Offset  new_size = old_size;

      new_size = new_size + ( new_size >> 1 ) + 4;

      /* if relocating to heap */
      if ( state->stack == state->stack_0 )
      {
        state->stack = NULL;
        old_size     = 0;
      }

      /* requirement of the character stack larger than 1<<LZW_MAX_BITS */
      /* implies bug in the decompression code                          */
      if ( new_size > ( 1 << LZW_MAX_BITS ) )
      {
        new_size = 1 << LZW_MAX_BITS;
        if ( new_size == old_size )
          return -1;
      }

      if ( FT_QREALLOC( state->stack, old_size, new_size ) )
        return -1;

      /* if relocating to heap */
      if ( old_size == 0 )
        FT_MEM_COPY( state->stack, state->stack_0, FT_LZW_DEFAULT_STACK_SIZE );

      state->stack_size = new_size;
    }
    return 0;
  }